

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::BlockConnected
          (ValidationSignals *this,ChainstateRole role,shared_ptr<const_CBlock> *pblock,
          CBlockIndex *pindex)

{
  bool bVar1;
  pointer pTVar2;
  LogFlags in_RCX;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  Level in_stack_00000020;
  char **in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  int *in_stack_00000040;
  char *local_name;
  anon_class_40_4_bc35ff05_for_event event;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  char *in_stack_fffffffffffffe80;
  anon_class_40_4_bc35ff05_for_event *in_stack_fffffffffffffe88;
  anon_class_72_4_f5b1b096 *in_stack_fffffffffffffe90;
  CBlockHeader *in_stack_fffffffffffffe98;
  int source_line;
  ConstevalFormatString<3U> in_stack_ffffffffffffff28;
  string_view in_stack_ffffffffffffff30;
  string_view in_stack_ffffffffffffff40;
  char *local_78 [10];
  long local_8;
  
  source_line = (int)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::shared_ptr<const_CBlock>::shared_ptr
            ((shared_ptr<const_CBlock> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             (shared_ptr<const_CBlock> *)0x14f4fc0);
  local_78[0] = "BlockConnected";
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe98,
               (char *)in_stack_fffffffffffffe90);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe98,
               (char *)in_stack_fffffffffffffe90);
    std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    CBlockHeader::GetHash(in_stack_fffffffffffffe98);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe98 = (CBlockHeader *)(in_RCX + (BENCH|HTTP));
    in_stack_fffffffffffffe90 = (anon_class_72_4_f5b1b096 *)&stack0xffffffffffffffd8;
    in_stack_fffffffffffffe88 = (anon_class_40_4_bc35ff05_for_event *)local_78;
    in_stack_fffffffffffffe80 = "Enqueuing %s: block hash=%s block height=%d\n";
    in_stack_fffffffffffffe78 = 1;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,int>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff30,source_line,in_RCX,
               in_stack_00000020,in_stack_ffffffffffffff28,in_stack_00000030,in_stack_00000038,
               in_stack_00000040);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  pTVar2 = std::
           unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
           operator->((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                       *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::shared_ptr<const_CBlock>::shared_ptr
            ((shared_ptr<const_CBlock> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             (shared_ptr<const_CBlock> *)0x14f5167);
  BlockConnected(ChainstateRole,std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::$_1::__1
            (in_stack_fffffffffffffe88,
             (anon_class_40_4_bc35ff05_for_event *)in_stack_fffffffffffffe80);
  std::function<void()>::
  function<ValidationSignals::BlockConnected(ChainstateRole,std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::__0,void>
            ((function<void_()> *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  (*pTVar2->_vptr_TaskRunnerInterface[2])(pTVar2,&stack0xffffffffffffff48);
  std::function<void_()>::~function
            ((function<void_()> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  BlockConnected(ChainstateRole,std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::$_0::~__0
            ((anon_class_72_4_f5b1b096 *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  BlockConnected(ChainstateRole,std::shared_ptr<CBlock_const>const&,CBlockIndex_const*)::$_1::~__1
            ((anon_class_40_4_bc35ff05_for_event *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValidationSignals::BlockConnected(ChainstateRole role, const std::shared_ptr<const CBlock> &pblock, const CBlockIndex *pindex) {
    auto event = [role, pblock, pindex, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.BlockConnected(role, pblock, pindex); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block hash=%s block height=%d", __func__,
                          pblock->GetHash().ToString(),
                          pindex->nHeight);
}